

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall
HEkkDualRow::debugReportBfrtVar
          (HEkkDualRow *this,HighsInt ix,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pass_workData)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type vVar4;
  value_type vVar5;
  uint uVar6;
  const_reference pvVar7;
  reference pvVar8;
  int iVar9;
  uint uVar10;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDX;
  uint in_ESI;
  long *in_RDI;
  double dVar11;
  bool infeasible;
  double new_dual_infeasibility;
  double new_dual;
  double dual;
  HighsInt move;
  double value;
  HighsInt iCol;
  double Td;
  HighsInt move_out;
  
  if ((int)in_ESI < 0) {
    printf(
          "Ix iCol Mv       Lower      Primal       Upper       Value        Dual       Ratio      NwDual Ifs\n"
          );
  }
  else {
    iVar9 = 1;
    if ((double)in_RDI[0x15] < 0.0) {
      iVar9 = -1;
    }
    dVar1 = *(double *)(*(long *)(*in_RDI + 8) + 0x120);
    pvVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](in_RDX,(long)(int)in_ESI);
    uVar6 = pvVar7->first;
    pvVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](in_RDX,(long)(int)in_ESI);
    dVar2 = pvVar7->second;
    uVar10 = (uint)*(char *)(in_RDI[3] + (long)(int)uVar6);
    dVar3 = *(double *)(in_RDI[4] + (long)(int)uVar6 * 8);
    dVar11 = -((double)(int)(iVar9 * uVar10) * (double)in_RDI[0x17]) * dVar2 + dVar3;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x25a8),
                        (long)(int)uVar6);
    vVar4 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x25f0),
                        (long)(int)uVar6);
    vVar5 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x25c0),
                        (long)(int)uVar6);
    printf("%2d %4d %2d %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %3d\n",vVar4,vVar5,*pvVar8,
           dVar2,dVar3,ABS(dVar3 / dVar2),SUB84(dVar11,0),(ulong)in_ESI,(ulong)uVar6,(ulong)uVar10,
           (ulong)((double)(int)uVar10 * dVar11 < -dVar1));
  }
  return;
}

Assistant:

void HEkkDualRow::debugReportBfrtVar(
    const HighsInt ix,
    const std::vector<std::pair<HighsInt, double>>& pass_workData) const {
  if (ix < 0) {
    printf(
        "Ix iCol Mv       Lower      Primal       Upper       Value        "
        "Dual       Ratio      NwDual Ifs\n");
    return;
  }
  const HighsInt move_out = workDelta < 0 ? -1 : 1;
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  const HighsInt iCol = pass_workData[ix].first;
  const double value = pass_workData[ix].second;
  const HighsInt move = workMove[iCol];
  const double dual = workDual[iCol];
  const double new_dual = dual - move_out * move * workTheta * value;
  const double new_dual_infeasibility = move * new_dual;
  const bool infeasible = new_dual_infeasibility < -Td;
  printf("%2d %4d %2d %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %3d\n",
         (int)ix, (int)iCol, (int)move, ekk_instance_.info_.workLower_[iCol],
         ekk_instance_.info_.workValue_[iCol],
         ekk_instance_.info_.workUpper_[iCol], value, dual, fabs(dual / value),
         new_dual, infeasible);
}